

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

void llvm::logAllUnhandledErrors(Error *E,raw_ostream *OS,Twine ErrorBanner)

{
  ErrorInfoBase *pEVar1;
  _func_int *p_Var2;
  anon_class_8_1_3fcf62a2 aVar3;
  char cVar4;
  ulong uVar5;
  ErrorInfoBase EVar6;
  Error EVar7;
  _func_int *p_Var8;
  Error local_68;
  raw_ostream *local_60;
  Error local_58;
  anon_class_8_1_3fcf62a2 local_50;
  _func_int **local_48;
  anon_class_8_1_3fcf62a2 local_40;
  Error local_38;
  
  uVar5 = (ulong)E->Payload & 0xfffffffffffffffe;
  E->Payload = (ErrorInfoBase *)(uVar5 != 0 | uVar5);
  if (uVar5 != 0) {
    Twine::print(&ErrorBanner,OS);
    pEVar1 = E->Payload;
    E->Payload = (ErrorInfoBase *)0x0;
    EVar6._vptr_ErrorInfoBase = (_func_int **)((ulong)pEVar1 & 0xfffffffffffffffe);
    local_60 = OS;
    if (EVar6._vptr_ErrorInfoBase == (_func_int **)0x0) {
      local_38.Payload = (ErrorInfoBase *)0x1;
    }
    else {
      cVar4 = (**(code **)(*EVar6._vptr_ErrorInfoBase + 0x30))(EVar6._vptr_ErrorInfoBase);
      if (cVar4 == '\0') {
        local_40.OS = (raw_ostream *)EVar6._vptr_ErrorInfoBase;
        handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                  ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                   &local_38,&local_40);
        if (local_40.OS != (raw_ostream *)0x0) {
          (*(local_40.OS)->_vptr_raw_ostream[1])();
        }
        local_40.OS = (raw_ostream *)0x0;
        EVar6._vptr_ErrorInfoBase = (_func_int **)0x0;
        EVar7.Payload = local_38.Payload;
      }
      else {
        local_38.Payload = (ErrorInfoBase *)0x1;
        p_Var8 = EVar6._vptr_ErrorInfoBase[1];
        p_Var2 = EVar6._vptr_ErrorInfoBase[2];
        EVar7.Payload = (ErrorInfoBase *)0x1;
        local_48 = EVar6._vptr_ErrorInfoBase;
        if (p_Var8 != p_Var2) {
          do {
            local_50.OS = *(raw_ostream **)p_Var8;
            *(long *)p_Var8 = 0;
            local_58.Payload = EVar7.Payload;
            handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                      ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *
                       )&local_68,&local_50);
            ErrorList::join((ErrorList *)&local_40,&local_58,&local_68);
            aVar3.OS = local_40.OS;
            local_40.OS = (raw_ostream *)0x0;
            if ((long *)((ulong)local_68.Payload & 0xfffffffffffffffe) != (long *)0x0) {
              (**(code **)(*(long *)((ulong)local_68.Payload & 0xfffffffffffffffe) + 8))();
            }
            if (local_50.OS != (raw_ostream *)0x0) {
              (*(local_50.OS)->_vptr_raw_ostream[1])();
            }
            local_50.OS = (raw_ostream *)0x0;
            if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
              (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
            }
            EVar7.Payload = (ErrorInfoBase *)((ulong)aVar3.OS | 1);
            p_Var8 = p_Var8 + 8;
            EVar6._vptr_ErrorInfoBase = local_48;
          } while (p_Var8 != p_Var2);
        }
      }
      local_38.Payload = EVar7.Payload;
      if (EVar6._vptr_ErrorInfoBase != (_func_int **)0x0) {
        (**(code **)(*EVar6._vptr_ErrorInfoBase + 8))();
      }
    }
    cantFail(&local_38,(char *)0x0);
    if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
    }
  }
  return;
}

Assistant:

void logAllUnhandledErrors(Error E, raw_ostream &OS, Twine ErrorBanner) {
  if (!E)
    return;
  OS << ErrorBanner;
  handleAllErrors(std::move(E), [&](const ErrorInfoBase &EI) {
    EI.log(OS);
    OS << "\n";
  });
}